

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isNearestSampleResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vector<float,_4> *result)

{
  bool bVar1;
  int i_00;
  int j_00;
  int i;
  int c;
  int j;
  int c_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<float,_4> color;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  tcu local_40 [16];
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar2 = floorf(local_48);
  fVar3 = floorf(local_44);
  fVar4 = floorf(local_50);
  fVar5 = floorf(local_4c);
  for (c_00 = (int)fVar4; c = (int)fVar2, c_00 <= (int)fVar5; c_00 = c_00 + 1) {
    while (c <= (int)fVar3) {
      i_00 = TexVerifierUtil::wrap(sampler->wrapS,c,(level->m_size).m_data[0]);
      j_00 = TexVerifierUtil::wrap(sampler->wrapT,c_00,(level->m_size).m_data[1]);
      lookup<float>(local_40,level,sampler,i_00,j_00,coordZ);
      bVar1 = isColorValid(prec,(Vec4 *)local_40,result);
      c = c + 1;
      if (bVar1) goto LAB_01617798;
    }
  }
LAB_01617798:
  return c_00 <= (int)fVar5;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const Vec2&							coord,
										const int							coordZ,
										const Vector<ScalarType, 4>&		result)
{
	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());
	const int		minJ			= deFloorFloatToInt32(vBounds.x());
	const int		maxJ			= deFloorFloatToInt32(vBounds.y());

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			const int					x		= wrap(sampler.wrapS, i, level.getWidth());
			const int					y		= wrap(sampler.wrapT, j, level.getHeight());
			const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, y, coordZ);

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}